

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O3

int __thiscall
helics::NetworkCommsInterface::PortAllocator::findOpenPort
          (PortAllocator *this,int count,string_view host)

{
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *this_00;
  mapped_type mVar1;
  string_view host_00;
  string_view host_01;
  string_view host_02;
  long *plVar2;
  _Base_ptr p_Var3;
  iterator iVar4;
  mapped_type *pmVar5;
  int port;
  size_type __rlen;
  int port_00;
  bool bVar6;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  key_type local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  plVar2 = (long *)host._M_str;
  p_Var3 = (_Base_ptr)host._M_len;
  do {
    local_50._M_len = (size_t)p_Var3;
    local_50._M_str = (char *)plVar2;
    if ((_Base_ptr)local_50._M_len == (_Base_ptr)0x3) {
      bVar6 = *(char *)((long)local_50._M_str + 2) == '1' &&
              (short)*(long *)local_50._M_str == 0x3a3a;
    }
    else {
      if ((_Base_ptr)local_50._M_len != (_Base_ptr)0x9) break;
      bVar6 = (char)*(long *)((long)local_50._M_str + 8) == '1' &&
              *(long *)local_50._M_str == 0x2e302e302e373231;
    }
    plVar2 = (long *)"localhost";
    p_Var3 = (_Base_ptr)0x9;
  } while (bVar6);
  this_00 = &this->nextPorts;
  iVar4 = CLI::std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                  *)this_00,&local_50);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->nextPorts)._M_t._M_impl.super__Rb_tree_header) {
    port_00 = this->startingPort;
    local_40._M_len = local_50._M_len;
    local_40._M_str = local_50._M_str;
    pVar7 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->hosts,&local_40);
    local_50._M_str = *(char **)(pVar7.first._M_node._M_node + 1);
    local_50._M_len = (size_t)pVar7.first._M_node._M_node[1]._M_parent;
    mVar1 = this->startingPort;
    pmVar5 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[](this_00,(key_type *)&local_50);
    *pmVar5 = mVar1;
    pmVar5 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[](this_00,(key_type *)&local_50);
    *pmVar5 = *pmVar5 + count;
  }
  else {
    port_00 = *(int *)&iVar4._M_node[1]._M_left;
    *(int *)&iVar4._M_node[1]._M_left = port_00 + count;
  }
  host_00._M_str = local_50._M_str;
  host_00._M_len = local_50._M_len;
  bVar6 = isPortUsed(this,host_00,port_00);
  if (bVar6) {
    do {
      port_00 = port_00 + 1;
      host_01._M_str = local_50._M_str;
      host_01._M_len = local_50._M_len;
      bVar6 = isPortUsed(this,host_01,port_00);
    } while (bVar6);
    pmVar5 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[](this_00,(key_type *)&local_50);
    *pmVar5 = count + port_00;
  }
  port = port_00;
  if (0 < count) {
    do {
      host_02._M_str = local_50._M_str;
      host_02._M_len = local_50._M_len;
      addUsedPort(this,host_02,port);
      count = count + -1;
      port = port + 1;
    } while (count != 0);
  }
  return port_00;
}

Assistant:

int NetworkCommsInterface::PortAllocator::findOpenPort(int count, std::string_view host)
{
    if ((host == "127.0.0.1") || (host == "::1")) {
        return findOpenPort(count, localHostString);
    }
    auto np = nextPorts.find(host);
    int nextPort = startingPort;
    if (np == nextPorts.end()) {
        host = addNewHost(host);
        nextPorts[host] = startingPort;
        nextPorts[host] += count;
    } else {
        nextPort = np->second;
        (np->second) += count;
    }
    if (isPortUsed(host, nextPort)) {
        ++nextPort;
        while (isPortUsed(host, nextPort)) {
            ++nextPort;
        }
        nextPorts[host] = nextPort + count;
    }
    for (int ii = 0; ii < count; ++ii) {
        addUsedPort(host, nextPort + ii);
    }
    return nextPort;
}